

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_cpu.cpp
# Opt level: O2

void __thiscall
geemuboi::test::core::CpuTest_ld_ma16_sp_Test::TestBody(CpuTest_ld_ma16_sp_Test *this)

{
  MockMmu *this_00;
  undefined2 uVar1;
  TypedExpectation<unsigned_short_(unsigned_short)> *this_01;
  char *message;
  linked_ptr<int> local_98;
  MatcherBase<unsigned_short> local_88;
  MockSpec<unsigned_short_(unsigned_short)> local_70;
  AssertionResult gtest_ar;
  
  (this->super_CpuTest).regs.sp = 0xffee;
  this_00 = &(this->super_CpuTest).mmu;
  uVar1 = (this->super_CpuTest).regs.pc;
  testing::Matcher<unsigned_short>::Matcher((Matcher<unsigned_short> *)&local_88,uVar1 + 1);
  MockMmu::gmock_read_word(&local_70,this_00,(Matcher<unsigned_short> *)&local_88);
  testing::internal::GetWithoutMatchers();
  this_01 = testing::internal::MockSpec<unsigned_short_(unsigned_short)>::InternalExpectedAt
                      (&local_70,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/cjuub[P]geemuboi/test/core/test_cpu.cpp"
                       ,0xe3,"mmu","read_word(regs.pc + 1)");
  local_98.value_ = (int *)operator_new(4);
  *local_98.value_ = 0xccdd;
  local_98.link_.next_ = &local_98.link_;
  testing::internal::ReturnAction::operator_cast_to_Action
            ((Action<unsigned_short_(unsigned_short)> *)&gtest_ar,(ReturnAction *)&local_98);
  testing::internal::TypedExpectation<unsigned_short_(unsigned_short)>::WillOnce
            (this_01,(Action<unsigned_short_(unsigned_short)> *)&gtest_ar);
  testing::Action<unsigned_short_(unsigned_short)>::~Action
            ((Action<unsigned_short_(unsigned_short)> *)&gtest_ar);
  testing::internal::linked_ptr<int>::~linked_ptr(&local_98);
  testing::internal::MatcherBase<unsigned_short>::~MatcherBase
            ((MatcherBase<unsigned_short> *)&local_70.matchers_);
  testing::internal::MatcherBase<unsigned_short>::~MatcherBase(&local_88);
  testing::Matcher<unsigned_short>::Matcher((Matcher<unsigned_short> *)&local_70,0xccdd);
  testing::Matcher<unsigned_short>::Matcher
            ((Matcher<unsigned_short> *)&local_88,(this->super_CpuTest).regs.sp);
  MockMmu::gmock_write_word
            ((MockSpec<void_(unsigned_short,_unsigned_short)> *)&gtest_ar,this_00,
             (Matcher<unsigned_short> *)&local_70,(Matcher<unsigned_short> *)&local_88);
  testing::internal::GetWithoutMatchers();
  testing::internal::MockSpec<void_(unsigned_short,_unsigned_short)>::InternalExpectedAt
            ((MockSpec<void_(unsigned_short,_unsigned_short)> *)&gtest_ar,
             "/workspace/llm4binary/github/license_all_cmakelists_25/cjuub[P]geemuboi/test/core/test_cpu.cpp"
             ,0xe4,"mmu","write_word(0xCCDD, regs.sp)");
  std::_Tuple_impl<0UL,_testing::Matcher<unsigned_short>,_testing::Matcher<unsigned_short>_>::
  ~_Tuple_impl((_Tuple_impl<0UL,_testing::Matcher<unsigned_short>,_testing::Matcher<unsigned_short>_>
                *)&gtest_ar.message_);
  testing::internal::MatcherBase<unsigned_short>::~MatcherBase(&local_88);
  testing::internal::MatcherBase<unsigned_short>::~MatcherBase
            ((MatcherBase<unsigned_short> *)&local_70);
  CpuTest::execute_instruction(&this->super_CpuTest,'\b');
  local_70.function_mocker_ = (FunctionMockerBase<unsigned_short_(unsigned_short)> *)0x0;
  local_70.matchers_.super__Tuple_impl<0UL,_testing::Matcher<unsigned_short>_>.
  super__Head_base<0UL,_testing::Matcher<unsigned_short>,_false>._M_head_impl.
  super_MatcherBase<unsigned_short>._vptr_MatcherBase._0_4_ = 0xffee0003;
  CpuTest::verify_state_changes(&this->super_CpuTest,(Registers *)&local_70);
  local_88._vptr_MatcherBase._0_4_ =
       (*((this->super_CpuTest).cpu._M_t.
          super___uniq_ptr_impl<geemuboi::core::ICpu,_std::default_delete<geemuboi::core::ICpu>_>.
          _M_t.
          super__Tuple_impl<0UL,_geemuboi::core::ICpu_*,_std::default_delete<geemuboi::core::ICpu>_>
          .super__Head_base<0UL,_geemuboi::core::ICpu_*,_false>._M_head_impl)->_vptr_ICpu[1])();
  local_98.value_ = (int *)CONCAT44(local_98.value_._4_4_,5);
  testing::internal::CmpHelperEQ<unsigned_int,int>
            ((internal *)&gtest_ar,"cpu->get_cycles_executed()","5",(uint *)&local_88,
             (int *)&local_98);
  if (gtest_ar.success_ == false) {
    testing::Message::Message((Message *)&local_88);
    if (gtest_ar.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      message = "";
    }
    else {
      message = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_98,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/cjuub[P]geemuboi/test/core/test_cpu.cpp"
               ,0xec,message);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_98,(Message *)&local_88);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_98);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&local_88);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar.message_);
  return;
}

Assistant:

TEST_F(CpuTest, ld_ma16_sp) {
    regs.sp = 0xFFEE;
    EXPECT_CALL(mmu, read_word(regs.pc + 1)).WillOnce(Return(0xCCDD));
    EXPECT_CALL(mmu, write_word(0xCCDD, regs.sp));
    execute_instruction(0x08);

    ICpu::Registers expected_regs{};
    expected_regs.sp = 0xFFEE;
    expected_regs.pc = 3;
    verify_state_changes(expected_regs);

    EXPECT_EQ(cpu->get_cycles_executed(), 5);
}